

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsModule.c
# Opt level: O1

cs_err option(cs_struct *handle,cs_opt_type type,size_t value)

{
  cs_err cVar1;
  uint8_t *puVar2;
  
  cVar1 = CS_ERR_OK;
  if (type == CS_OPT_SYNTAX) {
    if (value < 2) {
      handle->printer = X86_Intel_printInst;
      handle->syntax = 1;
      return cVar1;
    }
    if (value != 2) {
      handle->errnum = CS_ERR_OPTION;
      return CS_ERR_OPTION;
    }
    handle->printer = X86_ATT_printInst;
    handle->syntax = 2;
  }
  else if (type == CS_OPT_MODE) {
    if (value == 8) {
      puVar2 = regsize_map_64;
    }
    else {
      puVar2 = regsize_map_32;
    }
    handle->regsize_map = puVar2;
    handle->mode = (cs_mode)value;
    return cVar1;
  }
  return cVar1;
}

Assistant:

static cs_err option(cs_struct *handle, cs_opt_type type, size_t value)
{
	if (type == CS_OPT_MODE) {
		if (value & CS_MODE_32)
			handle->disasm = Mips_getInstruction;
		else
			handle->disasm = Mips64_getInstruction;

		handle->mode = (cs_mode)value;
	}
	return CS_ERR_OK;
}